

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfdata.cpp
# Opt level: O2

long __thiscall PFData::getSubgridOffsetElements(PFData *this,int gridZ,int gridY,int gridX)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  
  iVar9 = this->m_ny;
  iVar3 = this->m_nz / this->m_r;
  iVar4 = this->m_nz % this->m_r;
  iVar1 = this->m_p;
  iVar7 = iVar9 / iVar1;
  iVar5 = iVar9 % this->m_q;
  iVar2 = this->m_nx;
  iVar6 = gridZ;
  if (iVar4 < gridZ) {
    iVar6 = iVar4;
  }
  lVar8 = (long)(int)((uint)(gridZ < iVar4) + iVar3);
  lVar10 = (long)(iVar6 * iVar9 * iVar2 * (iVar3 + 1));
  if (iVar4 <= gridZ) {
    lVar10 = lVar10 + (gridZ - iVar4) * iVar9 * iVar2 * iVar3;
  }
  iVar9 = gridY;
  if (iVar5 < gridY) {
    iVar9 = iVar5;
  }
  lVar10 = (long)iVar9 * (long)((iVar7 + 1) * iVar2) * lVar8 + lVar10;
  if (iVar5 <= gridY) {
    lVar10 = lVar10 + (long)(gridY - iVar5) * (long)(iVar7 * iVar2) * lVar8;
  }
  iVar6 = iVar2 % iVar1;
  iVar9 = gridX;
  if (iVar6 < gridX) {
    iVar9 = iVar6;
  }
  lVar8 = (int)((uint)(gridY < iVar5) + iVar7) * lVar8;
  lVar10 = (long)iVar9 * (long)(iVar2 / iVar1 + 1) * lVar8 + lVar10;
  if (iVar6 <= gridX) {
    lVar10 = lVar10 + lVar8 * (long)(gridX - iVar6) * (long)(iVar2 / iVar1);
  }
  return lVar10;
}

Assistant:

long PFData::getSubgridOffsetElements(int gridZ, int gridY, int gridX) const{
    //NOTE: recall that remainder blocks come first, followed by normal blocks.
    //Grid dimensions of targeted block
    const long currBlockSizeZ = getSubgridSizeZ(gridZ);   //Size of the targeted Z block
    const long currBlockSizeY = getSubgridSizeY(gridY);   //Size of the targeted Y block;

    //--Calculate Z
    //Remainder blocks
    long elements = (m_nx * m_ny * (getNormalBlockSizeZ()+1))* std::min(gridZ, getNormalBlockStartGridZ());

    //Normal blocks
    if(gridZ >= getNormalBlockStartGridZ()){
        elements += (m_nx * m_ny * getNormalBlockSizeZ()) * (gridZ - getNormalBlockStartGridZ());
    }

    //--Calculate Y
    //Remainder blocks
    elements += (m_nx * (getNormalBlockSizeY()+1) * currBlockSizeZ) * std::min(gridY, getNormalBlockStartGridY());

    //Normal blocks
    if(gridY >= getNormalBlockStartGridY()){
        elements += (m_nx * getNormalBlockSizeY() * currBlockSizeZ) * (gridY - getNormalBlockStartGridY());
    }

    //--Calculate X
    //Remainder blocks
    elements += ((getNormalBlockSizeX()+1) * currBlockSizeY * currBlockSizeZ) * std::min(gridX, getNormalBlockStartGridX());

    //Normal blocks
    if(gridX >= getNormalBlockStartGridX()){
        elements += (getNormalBlockSizeX() * currBlockSizeY * currBlockSizeZ) * (gridX - getNormalBlockStartGridX());
    }

    return elements;
}